

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::setIdle(ConnectionImpl *this,bool idle)

{
  bool bVar1;
  Fault local_50;
  Fault f;
  undefined1 local_40 [8];
  DebugComparison<bool_&,_bool_&> _kjCondition;
  bool idle_local;
  ConnectionImpl *this_local;
  
  _kjCondition._39_1_ = idle;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (bool *)&_kjCondition.field_0x27);
  kj::_::DebugExpression<bool&>::operator!=
            ((DebugComparison<bool_&,_bool_&> *)local_40,(DebugExpression<bool&> *)&f,&this->idle);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<bool&,bool&>&>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x1dd,FAILED,"idle != this->idle","_kjCondition,",
               (DebugComparison<bool_&,_bool_&> *)local_40);
    kj::_::Debug::Fault::fatal(&local_50);
  }
  this->idle = (bool)(_kjCondition._39_1_ & 1);
  return;
}

Assistant:

void setIdle(bool idle) override {
      KJ_REQUIRE(idle != this->idle);
      this->idle = idle;
    }